

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemastypes.c
# Opt level: O2

int xmlSchemaCompareValues(xmlSchemaValPtr x,xmlSchemaValPtr y)

{
  xmlSchemaValType xtype;
  xmlSchemaValType ytype;
  xmlSchemaWhitespaceValueType yws;
  int iVar1;
  xmlSchemaWhitespaceValueType xws;
  
  if (y == (xmlSchemaValPtr)0x0 || x == (xmlSchemaValPtr)0x0) {
    return -2;
  }
  xtype = x->type;
  xws = xtype == XML_SCHEMAS_NORMSTRING ^ XML_SCHEMA_WHITESPACE_COLLAPSE;
  if (xtype == XML_SCHEMAS_STRING) {
    xws = XML_SCHEMA_WHITESPACE_PRESERVE;
  }
  ytype = y->type;
  yws = ytype == XML_SCHEMAS_NORMSTRING ^ XML_SCHEMA_WHITESPACE_COLLAPSE;
  if (ytype == XML_SCHEMAS_STRING) {
    yws = XML_SCHEMA_WHITESPACE_PRESERVE;
  }
  iVar1 = xmlSchemaCompareValuesInternal(xtype,x,(xmlChar *)0x0,xws,ytype,y,(xmlChar *)0x0,yws);
  return iVar1;
}

Assistant:

int
xmlSchemaCompareValues(xmlSchemaValPtr x, xmlSchemaValPtr y) {
    xmlSchemaWhitespaceValueType xws, yws;

    if ((x == NULL) || (y == NULL))
        return(-2);
    if (x->type == XML_SCHEMAS_STRING)
	xws = XML_SCHEMA_WHITESPACE_PRESERVE;
    else if (x->type == XML_SCHEMAS_NORMSTRING)
        xws = XML_SCHEMA_WHITESPACE_REPLACE;
    else
        xws = XML_SCHEMA_WHITESPACE_COLLAPSE;

    if (y->type == XML_SCHEMAS_STRING)
	yws = XML_SCHEMA_WHITESPACE_PRESERVE;
    else if (y->type == XML_SCHEMAS_NORMSTRING)
        yws = XML_SCHEMA_WHITESPACE_REPLACE;
    else
        yws = XML_SCHEMA_WHITESPACE_COLLAPSE;

    return(xmlSchemaCompareValuesInternal(x->type, x, NULL, xws, y->type,
	y, NULL, yws));
}